

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O2

void __thiscall
TEST_TestOutput_printTestsEndedWithNoTestsRunOrIgnored_Test::
TEST_TestOutput_printTestsEndedWithNoTestsRunOrIgnored_Test
          (TEST_TestOutput_printTestsEndedWithNoTestsRunOrIgnored_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).f3 = (TestFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).result = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).f = (TestFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).f2 = (TestFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).mock = (StringBufferTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).tst = (UtestShell *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).printer = (TestOutput *)0x0;
  TEST_GROUP_CppUTestGroupTestOutput::TEST_GROUP_CppUTestGroupTestOutput
            (&this->super_TEST_GROUP_CppUTestGroupTestOutput);
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_00375b60;
  return;
}

Assistant:

TEST(TestOutput, printTestsEndedWithNoTestsRunOrIgnored)
{
    result->countTest();
    printer->flush();
    printer->printTestsEnded(*result);
    STRCMP_EQUAL("\nErrors (ran nothing, 1 tests, 0 ran, 0 checks, 0 ignored, 0 filtered out, 10 ms)\n"
                 "Note: test run failed because no tests were run or ignored. Assuming something went wrong. "
                 "This often happens because of linking errors or typos in test filter.\n\n",
        mock->getOutput().asCharString());
}